

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.h
# Opt level: O2

QMetaEnum QMetaEnum::fromType<QFlags<Qt::KeyboardModifier>>(void)

{
  QMetaEnum QVar1;
  
  QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
  QVar1 = (QMetaEnum)QMetaObject::enumerator(0x7b8858);
  return QVar1;
}

Assistant:

static QMetaEnum fromType()
    {
        static_assert(QtPrivate::IsQEnumHelper<T>::Value,
                      "QMetaEnum::fromType only works with enums declared as "
                      "Q_ENUM, Q_ENUM_NS, Q_FLAG or Q_FLAG_NS");
        const QMetaObject *metaObject = qt_getEnumMetaObject(T());
        const char *name = qt_getEnumName(T());
        return metaObject->enumerator(metaObject->indexOfEnumerator(name));
    }